

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O2

Subtests * __thiscall
hwtest::pgraph::PGraphScanTests::subtests_abi_cxx11_
          (Subtests *__return_storage_ptr__,PGraphScanTests *this)

{
  mt19937 *this_00;
  TestOptions *pTVar1;
  Subtests *pSVar2;
  Test *this_01;
  result_type rVar3;
  ScanTest *pSVar4;
  long lVar5;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>
  __l;
  allocator local_269;
  Subtests *local_268;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_260;
  string local_238 [32];
  ScanTest *local_218;
  string local_210 [32];
  ScanTest *local_1f0;
  string local_1e8 [32];
  ScanTest *local_1c8;
  string local_1c0 [32];
  ScanTest *local_1a0;
  string local_198 [32];
  ScanTest *local_178;
  string local_170 [32];
  ScanTest *local_150;
  string local_148 [32];
  ScanTest *local_128;
  string local_120 [32];
  ScanTest *local_100;
  string local_f8 [32];
  ScanTest *local_d8;
  string local_d0 [32];
  ScanTest *local_b0;
  string local_a8 [32];
  ScanTest *local_88;
  string local_80 [32];
  ScanTest *local_60;
  string local_58 [32];
  ScanTest *local_38;
  
  this_01 = (Test *)operator_new(0x13c0);
  pTVar1 = (this->super_Test).opt;
  this_00 = &(this->super_Test).rnd;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  Test::Test(this_01,pTVar1,(uint32_t)rVar3);
  this_01->_vptr_Test = (_func_int **)&PTR__Test_0030adf0;
  local_268 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_260,"access",&local_269);
  local_260.second = this_01;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030ae50;
  std::__cxx11::string::string(local_238,"debug",&local_269);
  local_218 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030af10;
  std::__cxx11::string::string(local_210,"control",&local_269);
  local_1f0 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030af70;
  std::__cxx11::string::string(local_1e8,"canvas",&local_269);
  local_1c8 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030afd0;
  std::__cxx11::string::string(local_1c0,"vtx",&local_269);
  local_1a0 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b030;
  std::__cxx11::string::string(local_198,"clip",&local_269);
  local_178 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b090;
  std::__cxx11::string::string(local_170,"context",&local_269);
  local_150 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b0f0;
  std::__cxx11::string::string(local_148,"vstate",&local_269);
  local_128 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b150;
  std::__cxx11::string::string(local_120,"dma",&local_269);
  local_100 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b1b0;
  std::__cxx11::string::string(local_f8,"d3d0",&local_269);
  local_d8 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b210;
  std::__cxx11::string::string(local_d0,"d3d56",&local_269);
  local_b0 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b270;
  std::__cxx11::string::string(local_a8,"fe3d",&local_269);
  local_88 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b2d0;
  std::__cxx11::string::string(local_80,"celsius",&local_269);
  local_60 = pSVar4;
  pSVar4 = (ScanTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  anon_unknown_2::ScanTest::ScanTest(pSVar4,pTVar1,(uint32_t)rVar3);
  (pSVar4->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0030b330;
  std::__cxx11::string::string(local_58,"kelvin",&local_269);
  pSVar2 = local_268;
  __l._M_len = 0xe;
  __l._M_array = &local_260;
  local_38 = pSVar4;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>_>
  ::vector(local_268,__l,(allocator_type *)&local_269);
  lVar5 = 0x208;
  do {
    std::__cxx11::string::~string((string *)((long)&local_260.first._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x28);
  return pSVar2;
}

Assistant:

Test::Subtests PGraphScanTests::subtests() {
	return {
		{"access", new ScanAccessTest(opt, rnd())},
		{"debug", new ScanDebugTest(opt, rnd())},
		{"control", new ScanControlTest(opt, rnd())},
		{"canvas", new ScanCanvasTest(opt, rnd())},
		{"vtx", new ScanVtxTest(opt, rnd())},
		{"clip", new ScanClipTest(opt, rnd())},
		{"context", new ScanContextTest(opt, rnd())},
		{"vstate", new ScanVStateTest(opt, rnd())},
		{"dma", new ScanDmaTest(opt, rnd())},
		{"d3d0", new ScanD3D0Test(opt, rnd())},
		{"d3d56", new ScanD3D56Test(opt, rnd())},
		{"fe3d", new ScanFe3dTest(opt, rnd())},
		{"celsius", new ScanCelsiusTest(opt, rnd())},
		{"kelvin", new ScanKelvinTest(opt, rnd())},
	};
}